

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall Scine::Core::ModuleManager::Impl::getLoadedModuleNames_abi_cxx11_(Impl *this)

{
  bool bVar1;
  element_type *peVar2;
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  shared_ptr<Scine::Core::Module> *modulePtr;
  const_iterator __end3;
  const_iterator __begin3;
  ModuleList *__range3;
  LibraryAndModules *source;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list;
  value_type *in_stack_ffffffffffffff58;
  string local_88 [16];
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
  local_58;
  ModuleList *local_50;
  reference local_48;
  LibraryAndModules *local_40;
  __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
  local_38 [4];
  undefined1 local_11;
  
  local_11 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12876e);
  std::
  vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ::size(in_RSI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_38[0]._M_current =
       (LibraryAndModules *)
       std::
       vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
       ::begin((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                *)in_stack_ffffffffffffff58);
  local_40 = (LibraryAndModules *)
             std::
             vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
             ::end((vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
                    *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
                             *)in_stack_ffffffffffffff58), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
               ::operator*(local_38);
    local_50 = &local_48->modules;
    local_58._M_current =
         (shared_ptr<Scine::Core::Module> *)
         std::
         vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
         ::begin((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
                  *)in_stack_ffffffffffffff58);
    std::
    vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
    ::end((vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>
           *)in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
      ::operator*(&local_58);
      peVar2 = std::
               __shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Scine::Core::Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x128833);
      in_stack_ffffffffffffff58 = (value_type *)local_88;
      (**(code **)(*(long *)peVar2 + 0x10))();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(in_RDI,in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(local_88);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<Scine::Core::Module>_*,_std::vector<std::shared_ptr<Scine::Core::Module>,_std::allocator<std::shared_ptr<Scine::Core::Module>_>_>_>
      ::operator++(&local_58);
    }
    __gnu_cxx::
    __normal_iterator<const_Scine::Core::ModuleManager::Impl::LibraryAndModules_*,_std::vector<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>_>
    ::operator++(local_38);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> getLoadedModuleNames() const {
    std::vector<std::string> list;
    list.reserve(_sources.size());
    for (const auto& source : _sources) {
      for (const auto& modulePtr : source.modules) {
        list.push_back(modulePtr->name());
      }
    }
    return list;
  }